

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_idte(CPUS390XState_conflict *env,uint64_t r1,uint64_t r2,uint32_t m4)

{
  CPUState *src_cpu;
  abi_ptr addr;
  uint64_t uVar1;
  uintptr_t unaff_retaddr;
  ushort local_56;
  ushort local_54;
  uint16_t index;
  uint16_t i;
  uint16_t entries;
  uint64_t raddr;
  uint64_t entry;
  uint64_t table;
  uintptr_t ra;
  CPUState *cs;
  ushort uStack_20;
  uint32_t m4_local;
  uint64_t r2_local;
  uint64_t r1_local;
  CPUS390XState_conflict *env_local;
  
  src_cpu = env_cpu(env);
  local_56 = 0;
  if ((r2 & 0xff000) == 0) {
    if ((r2 & 0x800) == 0) {
      uStack_20 = (ushort)r2;
      switch((uint)r1 & 0xc) {
      case 0:
        local_56 = (ushort)(r2 >> 0x14) & 0x7ff;
        break;
      case 4:
        local_56 = (ushort)(r2 >> 0x1f) & 0x7ff;
        break;
      case 8:
        local_56 = (ushort)(r2 >> 0x2a) & 0x7ff;
        break;
      case 0xc:
        local_56 = (ushort)(r2 >> 0x35);
      }
      for (local_54 = 0; local_54 < (ushort)((uStack_20 & 0x7ff) + 1); local_54 = local_54 + 1) {
        addr = (r1 & 0xfffffffffffff000) + (long)(int)((uint)local_56 + (uint)local_54 & 0x7ff) * 8;
        uVar1 = cpu_ldq_mmuidx_ra_s390x(env,addr,3,unaff_retaddr);
        if ((uVar1 & 0x20) == 0) {
          cpu_stq_mmuidx_ra_s390x(env,addr,uVar1 | 0x20,3,unaff_retaddr);
        }
      }
    }
    if ((m4 & 1) == 0) {
      tlb_flush_all_cpus_synced_s390x(src_cpu);
    }
    else {
      tlb_flush_s390x(src_cpu);
    }
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(idte)(CPUS390XState *env, uint64_t r1, uint64_t r2, uint32_t m4)
{
    CPUState *cs = env_cpu(env);
    const uintptr_t ra = GETPC();
    uint64_t table, entry, raddr;
    uint16_t entries, i, index = 0;

    if (r2 & 0xff000) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    if (!(r2 & 0x800)) {
        /* invalidation-and-clearing operation */
        table = r1 & ASCE_ORIGIN;
        entries = (r2 & 0x7ff) + 1;

        switch (r1 & ASCE_TYPE_MASK) {
        case ASCE_TYPE_REGION1:
            index = (r2 >> 53) & 0x7ff;
            break;
        case ASCE_TYPE_REGION2:
            index = (r2 >> 42) & 0x7ff;
            break;
        case ASCE_TYPE_REGION3:
            index = (r2 >> 31) & 0x7ff;
            break;
        case ASCE_TYPE_SEGMENT:
            index = (r2 >> 20) & 0x7ff;
            break;
        }
        for (i = 0; i < entries; i++) {
            /* addresses are not wrapped in 24/31bit mode but table index is */
            raddr = table + ((index + i) & 0x7ff) * sizeof(entry);
            entry = cpu_ldq_mmuidx_ra(env, raddr, MMU_REAL_IDX, ra);
            if (!(entry & REGION_ENTRY_I)) {
                /* we are allowed to not store if already invalid */
                entry |= REGION_ENTRY_I;
                cpu_stq_mmuidx_ra(env, raddr, entry, MMU_REAL_IDX, ra);
            }
        }
    }

    /* We simply flush the complete tlb, therefore we can ignore r3. */
    if (m4 & 1) {
        tlb_flush(cs);
    } else {
        tlb_flush_all_cpus_synced(cs);
    }
}